

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  SPxOut *pSVar1;
  uint uVar2;
  type_conflict5 tVar3;
  bool bVar4;
  Result RVar5;
  int iVar6;
  Verbosity VVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar11;
  element_type *peVar12;
  bool *pbVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar15;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  ulong *puVar17;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  undefined1 *in_RDX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  int i_6;
  int i_5;
  int *perm;
  int nRowsOld;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  DataArray<int> da_perm_empty;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int j_2;
  DataArray<int> da_perm;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scaledRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scaledLhs;
  int i_4;
  int l_2;
  DataArray<bool> isLhsEqualRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxLhs;
  int minRhsIdx;
  int maxLhsIdx;
  int rowIdx;
  int k_5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  bool doChangeRanges;
  int j_tmp;
  int k_tmp;
  int i_3;
  int l_1;
  int k_4;
  int numDelRows;
  int idxLastDupRows;
  int idxFirstDupRows;
  int j_1;
  int *perm_tmp;
  int nRowsOld_tmp;
  int k_3;
  int k_2;
  DataArray<bool> remRow;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldVal;
  int i_1;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Verbosity old_verbosity;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  int rs_remRows;
  Result ret;
  int oldRows;
  int remNzos;
  int remRows;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe358;
  int i_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe360;
  DataArray<bool> *in_stack_ffffffffffffe368;
  undefined4 in_stack_ffffffffffffe370;
  undefined4 in_stack_ffffffffffffe374;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe398;
  undefined1 *puVar18;
  int **in_stack_ffffffffffffe3a0;
  undefined4 in_stack_ffffffffffffe470;
  undefined4 in_stack_ffffffffffffe474;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe478;
  ElementCompare *in_stack_ffffffffffffe480;
  int in_stack_ffffffffffffe48c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe560;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe568;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe570;
  int in_stack_ffffffffffffe5d0;
  uint in_stack_ffffffffffffe5d4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe5d8;
  DuplicateRowsPS *in_stack_ffffffffffffe5e0;
  bool local_19d5;
  undefined4 in_stack_ffffffffffffe650;
  uint in_stack_ffffffffffffe654;
  DataArray<int> *in_stack_ffffffffffffe658;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe660;
  undefined4 in_stack_ffffffffffffe678;
  uint in_stack_ffffffffffffe67c;
  undefined1 local_1938 [128];
  undefined4 local_18b8;
  Verbosity local_18b4;
  int local_18b0;
  int local_18ac;
  long local_18a8;
  int local_189c;
  int local_1898;
  undefined1 local_1814 [128];
  undefined1 local_1794 [131];
  undefined1 local_1711;
  undefined1 local_16f0 [128];
  undefined1 local_1670 [128];
  DataArray<bool> local_15f0;
  undefined1 local_15d8 [95];
  undefined1 local_1579;
  undefined1 local_1558 [128];
  undefined1 local_14d8 [128];
  DataArray<bool> local_1458;
  undefined1 local_1440 [68];
  uint local_13fc;
  DataArray<int> local_13f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_12e0;
  undefined1 local_12d8 [128];
  undefined1 local_1258 [128];
  ulong local_11d8;
  undefined1 local_11d0 [96];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee90;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee98;
  undefined1 local_1150 [128];
  undefined1 local_10d0 [128];
  undefined1 local_1050 [128];
  ulong local_fd0;
  ulong local_fc8;
  undefined1 local_fbc [128];
  undefined1 local_f3c [128];
  undefined4 local_ebc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_eb8;
  undefined1 local_e38 [128];
  undefined1 local_db8 [128];
  int local_d38;
  uint local_d34;
  DataArray<bool> local_d30;
  undefined1 local_d18 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c98;
  ulong local_c18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c0c;
  int local_b8c;
  int local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  undefined1 local_b78 [24];
  undefined1 local_b60 [27];
  byte local_b45;
  int local_b44;
  int local_b40;
  int local_b3c;
  uint local_b38;
  int local_b34;
  int local_b30;
  int local_b2c;
  int local_b28;
  int local_b24;
  long local_b20;
  int local_b14;
  undefined8 local_b10;
  undefined1 local_b08 [128];
  int local_a88;
  int local_a84;
  DataArray<bool> local_a80 [6];
  undefined1 local_9e8 [128];
  undefined1 local_968 [128];
  uint local_8e8;
  int local_8e4;
  Real local_8d0;
  undefined1 local_8c8 [232];
  int *in_stack_fffffffffffff820;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff828;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  uint uVar19;
  undefined1 local_7c0 [128];
  undefined8 local_740;
  int local_738;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_734;
  uint local_6b4;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6b0;
  int local_6a4;
  undefined8 local_6a0;
  undefined1 local_698 [128];
  undefined8 local_618;
  int local_60c;
  undefined8 local_608;
  IdxSet local_600;
  int *local_5d8;
  undefined1 local_5d0 [64];
  DataArray<int> local_590;
  uint local_578;
  Verbosity local_574;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_570;
  uint local_568;
  uint local_564;
  int local_560;
  int local_55c;
  fpclass_type local_558;
  int local_554;
  undefined1 *local_550;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_548;
  Result local_534;
  undefined8 local_530;
  undefined8 *local_528;
  undefined1 *local_520;
  undefined8 local_518;
  Real *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  ulong *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  ulong *local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  ulong *local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined1 *local_448;
  undefined8 local_440;
  ulong *local_438;
  undefined1 *local_430;
  undefined8 local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  undefined1 *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined1 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  undefined1 *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined8 local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_260;
  ulong *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  ulong *local_238;
  ulong *local_230;
  undefined8 local_228;
  ulong *local_220;
  undefined8 *local_218;
  Real *local_210;
  undefined8 *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  undefined8 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined8 *local_58;
  long local_50;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_41;
  int *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  int *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  
  local_554 = 0;
  local_558 = cpp_dec_float_finite;
  local_550 = in_RDX;
  local_548 = in_RSI;
  local_55c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x70df83);
  RVar5 = removeEmpty(in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
  if (RVar5 == OKAY) {
    local_564 = 0;
    local_560 = 0;
    for (local_568 = 0; uVar19 = local_568,
        iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x70dff4), (int)uVar19 < iVar6; local_568 = local_568 + 1) {
      local_570 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rowVector(in_stack_ffffffffffffe360,
                              (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(local_570);
      if (iVar6 == 1) {
        removeRowSingleton((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                           in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                           in_stack_fffffffffffff820);
        local_564 = local_564 + 1;
      }
    }
    if (((0 < (int)local_564) &&
        ((in_RDI->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout != (SPxOut *)0x0)) &&
       (VVar7 = SPxOut::getVerbosity
                          ((in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout), 3 < (int)VVar7)) {
      local_574 = SPxOut::getVerbosity
                            ((in_RDI->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).spxout);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_578 = 4;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_578);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                         (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                         (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe358);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_574);
    }
    iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x70e19d);
    if (iVar6 < 2) {
      local_534 = OKAY;
      RVar5 = local_534;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x70e1bf);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                 (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),(int)in_stack_ffffffffffffe368,
                 (Real)in_stack_ffffffffffffe360);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x70e1e5);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                 (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),(int)in_stack_ffffffffffffe368,
                 (Real)in_stack_ffffffffffffe360);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x70e21b);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
              (int)((ulong)in_stack_ffffffffffffe368 >> 0x20));
      local_5d8 = (int *)0x0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x70e253);
      spx_alloc<int*>(in_stack_ffffffffffffe3a0,(int)((ulong)in_stack_ffffffffffffe398 >> 0x20));
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x70e38a);
      IdxSet::IdxSet(&local_600,iVar6,local_5d8,0);
      piVar9 = DataArray<int>::operator[](&local_590,0);
      *piVar9 = 0;
      local_608 = 0;
      local_60 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe360,
                              (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
      local_68 = &local_608;
      local_58 = local_68;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_ffffffffffffe478,
                 (double)CONCAT44(in_stack_ffffffffffffe474,in_stack_ffffffffffffe470));
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x70e441);
      piVar9 = DataArray<int>::operator[]((DataArray<int> *)(local_5d0 + 0x28),0);
      *piVar9 = iVar6;
      for (local_60c = 1; iVar6 = local_60c,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70e488), iVar6 < iVar8; local_60c = local_60c + 1) {
        piVar9 = DataArray<int>::operator[](&local_590,local_60c);
        *piVar9 = 0;
        local_618 = 0;
        local_78 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffe360,
                                (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        local_80 = &local_618;
        local_70 = local_80;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  (in_stack_ffffffffffffe478,
                   (double)CONCAT44(in_stack_ffffffffffffe474,in_stack_ffffffffffffe470));
        piVar9 = DataArray<int>::operator[]((DataArray<int> *)(local_5d0 + 0x28),local_60c);
        *piVar9 = 0;
        IdxSet::addIdx(&local_600,local_60c);
      }
      local_6a0 = 0;
      local_520 = local_698;
      local_528 = &local_6a0;
      local_530 = 0;
      local_208 = local_528;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                 (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
      for (local_6a4 = 0; iVar6 = local_6a4,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70e62b), iVar6 < iVar8; local_6a4 = local_6a4 + 1) {
        local_6b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector(in_stack_ffffffffffffe360,
                                (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        local_6b4 = 0;
        while (in_stack_ffffffffffffe67c = local_6b4,
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(local_6b0), (int)in_stack_ffffffffffffe67c < iVar6) {
          local_3e8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value(local_6b0,local_6b4);
          local_3e0 = &local_734;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
          pcVar10 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_6b0,(char *)(ulong)local_6b4,__c);
          local_738 = (int)pcVar10;
          Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20))
          ;
          local_740 = 0;
          tVar3 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffe358,(double *)0x70e73b);
          in_stack_ffffffffffffe678 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffe678);
          if (tVar3) {
            local_270 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
            local_278 = &local_734;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
          }
          in_stack_ffffffffffffe658 = (DataArray<int> *)&in_RDI->m_classSetRows;
          DataArray<int>::operator[](&local_590,local_738);
          in_stack_ffffffffffffe660 =
               Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)in_stack_ffffffffffffe360,
                            (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          local_1b8 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          local_1b0 = &local_734;
          local_1a8 = local_7c0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1b9,local_1b0,local_1b8);
          local_1a0 = local_7c0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
          local_190 = local_1b0;
          local_198 = local_1b8;
          local_188 = local_7c0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                     (cpp_dec_float<200U,_int,_void> *)0x70e8a5);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffe360);
          piVar9 = DataArray<int>::operator[](&local_590,local_738);
          piVar9 = DataArray<int>::operator[]((DataArray<int> *)(local_5d0 + 0x28),*piVar9);
          iVar6 = *piVar9;
          *piVar9 = iVar6 + -1;
          if (iVar6 + -1 == 0) {
            piVar9 = DataArray<int>::operator[](&local_590,local_738);
            IdxSet::addIdx(&local_600,*piVar9);
          }
          local_6b4 = local_6b4 + 1;
        }
        in_stack_ffffffffffffe654 = 0;
        while (uVar19 = in_stack_ffffffffffffe654,
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(local_6b0), (int)in_stack_ffffffffffffe654 < iVar6) {
          pcVar10 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_6b0,(char *)(ulong)uVar19,__c_00);
          DataArray<int>::operator[](&local_590,(int)pcVar10);
          pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffe360,
                                 (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(&pDVar11->
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
          if (0 < iVar6) {
            SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_ffffffffffffe358);
            peVar12 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x70e9f1);
            local_8d0 = Tolerances::epsilon(peVar12);
            local_508 = local_8c8;
            local_510 = &local_8d0;
            local_518 = 0;
            local_210 = local_510;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                       (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
            ElementCompare::ElementCompare
                      ((ElementCompare *)in_stack_ffffffffffffe368,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe360);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x70ea97);
            pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
            iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar11->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            iVar6 = extraout_EDX;
            if (1 < iVar8) {
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::mem(&pDVar11->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(&pDVar11->
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (in_stack_ffffffffffffe490,in_stack_ffffffffffffe48c,
                         in_stack_ffffffffffffe480,(int)((ulong)in_stack_ffffffffffffe478 >> 0x20),
                         SUB81((ulong)in_stack_ffffffffffffe478 >> 0x18,0));
              iVar6 = extraout_EDX_00;
            }
            pcVar10 = IdxSet::index(&local_600,(char *)0x0,iVar6);
            local_8e4 = (int)pcVar10;
            IdxSet::remove(&local_600,(char *)0x0);
            local_8e8 = 0;
            while( true ) {
              uVar2 = local_8e8;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar11->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar8 = (int)((ulong)in_stack_ffffffffffffe358 >> 0x20);
              if (iVar6 <= (int)uVar2) break;
              local_19d5 = false;
              iVar6 = extraout_EDX_01;
              if (local_8e8 != 0) {
                pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)in_stack_ffffffffffffe360,iVar8);
                local_3d8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(&pDVar11->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,local_8e8);
                local_3d0 = local_968;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                local_3c0 = local_9e8;
                local_3c8 = local_698;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                epsZero(in_stack_ffffffffffffe398);
                local_19d5 = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                       (in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                                        in_stack_ffffffffffffe560);
                iVar6 = extraout_EDX_02;
              }
              if (local_19d5 != false) {
                pcVar10 = IdxSet::index(&local_600,(char *)0x0,iVar6);
                local_8e4 = (int)pcVar10;
                IdxSet::remove(&local_600,(char *)0x0);
              }
              iVar6 = local_8e4;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar11->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_8e8,__c_01);
              piVar9 = DataArray<int>::operator[](&local_590,*piVar9);
              *piVar9 = iVar6;
              piVar9 = DataArray<int>::operator[]((DataArray<int> *)(local_5d0 + 0x28),local_8e4);
              *piVar9 = *piVar9 + 1;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              local_288 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::value(&pDVar11->
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,local_8e8);
              local_280 = local_698;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              local_8e8 = local_8e8 + 1;
            }
            Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)in_stack_ffffffffffffe360,iVar8);
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x70ee0a);
          }
          in_stack_ffffffffffffe654 = uVar19 + 1;
        }
      }
      spx_free<int*>((int **)0x70ee47);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x70ee54);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                 (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),(int)in_stack_ffffffffffffe368,
                 (Real)in_stack_ffffffffffffe360);
      for (local_a84 = 0; iVar6 = local_a84,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70eea3), iVar6 < iVar8; local_a84 = local_a84 + 1) {
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x70eee5);
      }
      for (local_a88 = 0; iVar6 = local_a88,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70ef37), iVar6 < iVar8; local_a88 = local_a88 + 1) {
        pbVar13 = DataArray<bool>::operator[](local_a80,local_a88);
        *pbVar13 = false;
        DataArray<int>::operator[](&local_590,local_a88);
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        local_b10 = 0;
        local_4f0 = local_b08;
        local_4f8 = &local_b10;
        local_500 = 0;
        local_218 = local_4f8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                   (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
              (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_ffffffffffffe360);
      }
      local_b14 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70f06b);
      local_b20 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffe3a0,(int)((ulong)in_stack_ffffffffffffe398 >> 0x20));
      for (local_b24 = 0; local_b24 < local_b14; local_b24 = local_b24 + 1) {
        *(undefined4 *)(local_b20 + (long)local_b24 * 4) = 0;
      }
      local_b28 = -1;
      local_b2c = -1;
      local_b30 = 0;
      for (local_b34 = 0; iVar6 = local_b34,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70f130), iVar6 < iVar8; local_b34 = local_b34 + 1) {
        pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)in_stack_ffffffffffffe360,
                               (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar11->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar6) {
          in_stack_ffffffffffffe5d8 = local_548;
          pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffe360,
                                 (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar11->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_02);
          in_stack_ffffffffffffe5e0 =
               (DuplicateRowsPS *)
               SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::rowVector(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20)
                          );
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe5e0);
          if (iVar6 != 1) {
            local_b2c = local_b34;
            if (local_b28 < 0) {
              local_b28 = local_b34;
            }
            local_b38 = 1;
            while( true ) {
              in_stack_ffffffffffffe5d4 = local_b38;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar11->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar8 = (int)((ulong)in_stack_ffffffffffffe358 >> 0x20);
              if (iVar6 <= (int)in_stack_ffffffffffffe5d4) break;
              pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,iVar8);
              piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar11->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_b38,__c_03);
              local_b3c = *piVar9;
              *(undefined4 *)(local_b20 + (long)local_b3c * 4) = 0xffffffff;
              local_b38 = local_b38 + 1;
            }
            pDVar11 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffe360,iVar8);
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar11->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            local_b30 = iVar6 + -1 + local_b30;
          }
        }
      }
      local_b44 = 0;
      for (local_b40 = 0; local_b40 < local_b14; local_b40 = local_b40 + 1) {
        if (-1 < *(int *)(local_b20 + (long)local_b40 * 4)) {
          *(int *)(local_b20 + (long)local_b40 * 4) = local_b44;
          local_b44 = local_b44 + 1;
        }
      }
      local_b45 = 0;
      pVVar14 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x70f3a5);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe360,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe358);
      pDVar11 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x70f3d3);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe360,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe358);
      for (local_b7c = 0; iVar6 = local_b7c,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x70f41a), iVar6 < iVar8; local_b7c = local_b7c + 1) {
        pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)in_stack_ffffffffffffe360,
                               (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
        iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar15->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar6) {
          pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffe360,
                                 (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar15->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_04);
          pSVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector(in_stack_ffffffffffffe360,
                                (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar16);
          if (iVar6 != 1) {
            pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
            local_b80 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::size(&pDVar15->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
            SPxOut::
            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[34],_int,_0>
                      (in_RDI,(char (*) [34])"IMAISM53 {} duplicate rows found\n",&local_b80);
            pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar15->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            piVar9 = DataArray<int>::operator[](&in_RDI->m_stat,0xc);
            *piVar9 = iVar6 + -1 + *piVar9;
            local_b84 = -1;
            local_b88 = -1;
            local_b8c = -1;
            puVar17 = (ulong *)infinity();
            local_c18 = *puVar17 ^ 0x8000000000000000;
            local_4d8 = &local_c0c;
            local_4e0 = &local_c18;
            local_4e8 = 0;
            local_220 = local_4e0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                       (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
            local_4c8 = infinity();
            local_4c0 = local_d18;
            local_4d0 = 0;
            local_228 = local_4c8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                       (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
            boost::multiprecision::operator+
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe358);
            pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(&pDVar15->
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
            DataArray<bool>::DataArray
                      ((DataArray<bool> *)
                       CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                       (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),
                       (int)in_stack_ffffffffffffe368,(Real)in_stack_ffffffffffffe360);
            local_d34 = 0;
            while( true ) {
              uVar19 = local_d34;
              pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar15->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              i_00 = (int)((ulong)in_stack_ffffffffffffe358 >> 0x20);
              if (iVar6 <= (int)uVar19) break;
              pDVar15 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffe360,i_00);
              piVar9 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar15->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_d34,__c_05);
              local_d38 = *piVar9;
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              bVar4 = boost::multiprecision::operator==
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe358,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x70f79c);
              pbVar13 = DataArray<bool>::operator[](&local_d30,local_d34);
              *pbVar13 = bVar4;
              if (local_b84 == -1) {
                local_b84 = local_d38;
                local_298 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::lhs(in_stack_ffffffffffffe360,
                                  (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                local_290 = &local_c0c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                local_2a8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::rhs(in_stack_ffffffffffffe360,
                                  (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                local_2a0 = &local_c98;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              }
              else {
                local_3f8 = local_db8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                local_3f0 = local_e38;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                in_stack_ffffffffffffe560 =
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_5d0;
                in_stack_ffffffffffffe568 =
                     Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_ffffffffffffe360,
                                  (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                local_1f8 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffe360,
                                         (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                in_stack_ffffffffffffe570 = &local_eb8;
                local_1f0 = in_stack_ffffffffffffe568;
                local_1e8 = in_stack_ffffffffffffe570;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1f9,in_stack_ffffffffffffe568,local_1f8);
                local_1e0 = in_stack_ffffffffffffe570;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                local_1d0 = local_1f0;
                local_1d8 = local_1f8;
                local_1c8 = in_stack_ffffffffffffe570;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                           (cpp_dec_float<200U,_int,_void> *)0x70fa00);
                local_ebc = 0;
                tVar3 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe368,(int *)in_stack_ffffffffffffe360);
                iVar6 = (int)((ulong)in_stack_ffffffffffffe358 >> 0x20);
                if (tVar3) {
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe360,iVar6);
                  puVar17 = (ulong *)infinity();
                  local_fc8 = *puVar17 ^ 0x8000000000000000;
                  local_4a8 = local_fbc;
                  local_4b0 = &local_fc8;
                  local_4b8 = 0;
                  local_230 = local_4b0;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                             (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  tVar3 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffe358,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x70faea);
                  if (tVar3) {
                    puVar17 = (ulong *)infinity();
                    local_fd0 = *puVar17 ^ 0x8000000000000000;
                    local_490 = local_f3c;
                    local_498 = &local_fd0;
                    local_4a0 = 0;
                    local_238 = local_498;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                               (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  }
                  else {
                    local_b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::lhs(in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                    local_b8 = &local_eb8;
                    local_a8 = local_f3c;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_b9,local_b0,local_b8);
                    local_a0 = local_f3c;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                    local_90 = local_b0;
                    local_98 = local_b8;
                    local_88 = local_f3c;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                               (cpp_dec_float<200U,_int,_void> *)0x70fc5c);
                  }
                  local_300 = local_db8;
                  local_308 = local_f3c;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                  local_480 = infinity();
                  local_478 = local_10d0;
                  local_488 = 0;
                  local_240 = local_480;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                             (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  tVar3 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffe358,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x70fd24);
                  if (tVar3) {
                    local_468 = infinity();
                    local_460 = local_1050;
                    local_470 = 0;
                    local_248 = local_468;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                               (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  }
                  else {
                    local_f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::rhs(in_stack_ffffffffffffe360,
                                     (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                    local_f8 = &local_eb8;
                    local_e8 = local_1050;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_f9,local_f0,local_f8);
                    local_e0 = local_1050;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                    local_d0 = local_f0;
                    local_d8 = local_f8;
                    local_c8 = local_1050;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                               (cpp_dec_float<200U,_int,_void> *)0x70fe76);
                  }
                  local_310 = local_e38;
                  local_318 = local_1050;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                }
                else {
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffe360,iVar6);
                  local_450 = infinity();
                  local_448 = local_11d0;
                  local_458 = 0;
                  local_250 = local_450;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                             (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  tVar3 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffe358,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x70ff43);
                  if (tVar3) {
                    puVar17 = (ulong *)infinity();
                    local_11d8 = *puVar17 ^ 0x8000000000000000;
                    local_430 = local_1150;
                    local_438 = &local_11d8;
                    local_440 = 0;
                    local_258 = local_438;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                               (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  }
                  else {
                    local_130 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::rhs(in_stack_ffffffffffffe360,
                                      (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                    local_138 = &local_eb8;
                    local_128 = local_1150;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_139,local_130,local_138);
                    local_120 = local_1150;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                    local_110 = local_130;
                    local_118 = local_138;
                    local_108 = local_1150;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                               (cpp_dec_float<200U,_int,_void> *)0x7100b5);
                  }
                  local_320 = local_db8;
                  local_328 = local_1150;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                  puVar17 = (ulong *)infinity();
                  local_12e0._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (*puVar17 ^ 0x8000000000000000);
                  local_418 = local_12d8;
                  local_420 = &local_12e0;
                  local_428 = 0;
                  local_260 = local_420;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                             (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  tVar3 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffe358,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x71019d);
                  if (tVar3) {
                    local_408 = infinity();
                    local_400 = local_1258;
                    local_410 = 0;
                    local_268 = local_408;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                               (double)in_stack_ffffffffffffe368,in_stack_ffffffffffffe360);
                  }
                  else {
                    local_170 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::lhs(in_stack_ffffffffffffe360,
                                      (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                    local_178 = &local_eb8;
                    local_168 = local_1258;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_179,local_170,local_178);
                    local_160 = local_1258;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
                    local_150 = local_170;
                    local_158 = local_178;
                    local_148 = local_1258;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,
                               (cpp_dec_float<200U,_int,_void> *)0x7102ef);
                  }
                  local_330 = local_e38;
                  local_338 = local_1258;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                }
                tVar3 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe358,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x71033f);
                if (tVar3) {
                  local_2b0 = &local_c0c;
                  local_2b8 = local_db8;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                  local_b88 = local_d38;
                }
                tVar3 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe358,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x7103ad);
                if (tVar3) {
                  local_2c0 = &local_c98;
                  local_2c8 = local_e38;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                  local_b8c = local_d38;
                }
                pbVar13 = DataArray<bool>::operator[](local_a80,local_d38);
                *pbVar13 = true;
              }
              local_d34 = local_d34 + 1;
            }
            if (local_b84 == -1) {
LAB_00711102:
              local_1898 = 0;
            }
            else {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffe360,i_00);
              tVar3 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe358,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x710476);
              if (tVar3) {
                local_1b48 = &local_c0c;
              }
              else {
                local_1b48 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::lhs(in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              }
              local_3b0 = &local_1360;
              local_3b8 = local_1b48;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              tVar3 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe358,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x710536);
              if (tVar3) {
                local_1b68 = &local_c98;
              }
              else {
                local_1b68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::rhs(in_stack_ffffffffffffe360,
                                   (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              }
              local_3a0 = &local_13e0;
              local_3a8 = local_1b68;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              iVar6 = (int)((ulong)in_stack_ffffffffffffe368 >> 0x20);
              if (local_b7c == local_b2c) {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),iVar6,
                           (int)in_stack_ffffffffffffe368,(Real)in_stack_ffffffffffffe360);
                for (local_13fc = 0; (int)local_13fc < local_b14; local_13fc = local_13fc + 1) {
                  iVar6 = *(int *)(local_b20 + (long)(int)local_13fc * 4);
                  piVar9 = DataArray<int>::operator[](&local_13f8,local_13fc);
                  *piVar9 = iVar6;
                }
                operator_new(0x148);
                local_1579 = 1;
                Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)in_stack_ffffffffffffe360,
                             (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                        (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffe368);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                           (DataArray<int> *)in_stack_ffffffffffffe368);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                           in_stack_ffffffffffffe368);
                local_390 = local_14d8;
                local_398 = &local_1360;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                local_380 = local_1558;
                local_388 = &local_13e0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::tolerances(in_stack_ffffffffffffe358);
                peVar12 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x7107ae);
                Tolerances::epsilon(peVar12);
                EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                           (double)in_stack_ffffffffffffe560);
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe360,
                           (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe358);
                in_stack_ffffffffffffe368 = &local_1458;
                in_stack_ffffffffffffe360 =
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_1440;
                in_stack_ffffffffffffe358 =
                     (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(local_1440 + 0x18);
                in_stack_ffffffffffffe370 = 1;
                DuplicateRowsPS::DuplicateRowsPS
                          (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                           in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0,
                           (int)((ulong)pVVar14 >> 0x20),pDVar11,
                           (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                           in_stack_ffffffffffffe658,(DataArray<bool> *)in_stack_ffffffffffffe660,
                           SUB41((uint)iVar8 >> 0x18,0),SUB41((uint)iVar8 >> 0x10,0),
                           (shared_ptr<soplex::Tolerances> *)
                           CONCAT44(in_stack_ffffffffffffe67c,in_stack_ffffffffffffe678),
                           SUB41((uint)iVar8 >> 8,0));
                local_1579 = 0;
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                ::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            *)in_stack_ffffffffffffe360,(DuplicateRowsPS *)in_stack_ffffffffffffe358
                          );
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x7108d3);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x7108e0);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffe360);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x710907);
                Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          *)in_stack_ffffffffffffe360,
                         (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)in_stack_ffffffffffffe358);
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                               *)0x710932);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
              }
              else {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),iVar6,
                           (int)in_stack_ffffffffffffe368,(Real)in_stack_ffffffffffffe360);
                operator_new(0x148);
                local_1711 = 1;
                Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)in_stack_ffffffffffffe360,
                             (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                        (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffe368);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                           (DataArray<int> *)in_stack_ffffffffffffe368);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_ffffffffffffe374,in_stack_ffffffffffffe370),
                           in_stack_ffffffffffffe368);
                local_370 = local_1670;
                local_378 = &local_1360;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                local_360 = local_16f0;
                local_368 = &local_13e0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::tolerances(in_stack_ffffffffffffe358);
                peVar12 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x710bcd);
                Tolerances::epsilon(peVar12);
                EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                           (double)in_stack_ffffffffffffe560);
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe360,
                           (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe358);
                in_stack_ffffffffffffe368 = &local_15f0;
                in_stack_ffffffffffffe360 =
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_15d8;
                in_stack_ffffffffffffe358 =
                     (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(local_15d8 + 0x18);
                in_stack_ffffffffffffe370 = 0;
                DuplicateRowsPS::DuplicateRowsPS
                          (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                           in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0,
                           (int)((ulong)pVVar14 >> 0x20),pDVar11,
                           (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                           in_stack_ffffffffffffe658,(DataArray<bool> *)in_stack_ffffffffffffe660,
                           SUB41((uint)iVar8 >> 0x18,0),SUB41((uint)iVar8 >> 0x10,0),
                           (shared_ptr<soplex::Tolerances> *)
                           CONCAT44(in_stack_ffffffffffffe67c,in_stack_ffffffffffffe678),
                           SUB41((uint)iVar8 >> 8,0));
                local_1711 = 0;
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                ::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            *)in_stack_ffffffffffffe360,(DuplicateRowsPS *)in_stack_ffffffffffffe358
                          );
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x710cf2);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x710cff);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffe360);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x710d26);
                Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          *)in_stack_ffffffffffffe360,
                         (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)in_stack_ffffffffffffe358);
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                               *)0x710d51);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
              }
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
              tVar3 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe358,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x710eb2);
              if (!tVar3) {
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rhs(in_stack_ffffffffffffe360,(int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                tVar3 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe358,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x710efb);
                if (!tVar3) goto LAB_00711102;
              }
              local_b45 = 1;
              local_350 = local_1794;
              local_358 = &local_13e0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              local_340 = local_1814;
              local_348 = &local_1360;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
              feastol(in_stack_ffffffffffffe398);
              bVar4 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
                                 in_stack_ffffffffffffe560);
              if (!bVar4) {
                tVar3 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffe358,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x711033);
                if (tVar3) {
                  local_2d0 = &local_13e0;
                  local_2d8 = &local_1360;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                }
                local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffe360,
                                         (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                local_2e8 = &local_1360;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                local_2f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffe360,
                                         (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
                local_2f8 = &local_13e0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358);
                goto LAB_00711102;
              }
              SPxOut::
              debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[64],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                        (in_RDI,(char (*) [64])
                                "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n",
                         &local_1360,&local_13e0);
              spx_free<int*>((int **)0x711003);
              local_534 = INFEASIBLE;
              local_1898 = 1;
            }
            DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffe360);
            if (local_1898 != 0) goto LAB_007115e5;
          }
        }
      }
      if ((local_b45 & 1) != 0) {
        (*(local_548->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x38])(local_548,local_b60,local_b78,0);
      }
      iVar6 = (int)((ulong)in_stack_ffffffffffffe398 >> 0x20);
      local_189c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x711198);
      local_18a8 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffe3a0,iVar6);
      for (local_18ac = 0; local_18ac < local_189c; local_18ac = local_18ac + 1) {
        pbVar13 = DataArray<bool>::operator[](local_a80,local_18ac);
        if ((*pbVar13 & 1U) == 0) {
          *(undefined4 *)(local_18a8 + (long)local_18ac * 4) = 0;
        }
        else {
          *(undefined4 *)(local_18a8 + (long)local_18ac * 4) = 0xffffffff;
          local_554 = local_554 + 1;
          pSVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector(in_stack_ffffffffffffe360,
                                (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar16);
          local_558 = iVar6 + local_558;
        }
      }
      (*(local_548->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x11])(local_548,local_18a8);
      for (local_18b0 = 0; local_18b0 < local_189c; local_18b0 = local_18b0 + 1) {
        if (-1 < *(int *)(local_18a8 + (long)local_18b0 * 4)) {
          piVar9 = DataArray<int>::operator[](&in_RDI->m_rIdx,local_18b0);
          iVar6 = *piVar9;
          piVar9 = DataArray<int>::operator[]
                             (&in_RDI->m_rIdx,*(int *)(local_18a8 + (long)local_18b0 * 4));
          *piVar9 = iVar6;
        }
      }
      spx_free<int*>((int **)0x711356);
      spx_free<int*>((int **)0x711363);
      if (0 < (int)(local_554 + local_558)) {
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remRows = local_554 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remRows;
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remNzos = local_558 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remNzos;
        if (((in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout != (SPxOut *)0x0) &&
           (VVar7 = SPxOut::getVerbosity
                              ((in_RDI->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout), 3 < (int)VVar7)) {
          local_18b4 = SPxOut::getVerbosity
                                 ((in_RDI->
                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          local_18b8 = 4;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_18b8);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                             (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                             (int)((ulong)in_stack_ffffffffffffe358 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,(char *)in_stack_ffffffffffffe358);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffe360,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe358);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_18b4);
        }
        local_38 = &(in_RDI->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction;
        puVar18 = local_1938;
        local_40 = &local_55c;
        local_30 = puVar18;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_41,local_38);
        local_28 = puVar18;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360);
        local_18 = local_38;
        local_20 = local_40;
        local_50 = (long)*local_40;
        local_10 = puVar18;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe360,
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe358,(longlong *)0x711599)
        ;
        tVar3 = boost::multiprecision::operator>
                          (&in_stack_ffffffffffffe368->thesize,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe360);
        if (tVar3) {
          *local_550 = 1;
        }
      }
      local_534 = OKAY;
      local_1898 = 1;
LAB_007115e5:
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x7115f2);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x7115ff);
      DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffe360);
      IdxSet::~IdxSet((IdxSet *)in_stack_ffffffffffffe360);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x711626);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffe360);
      RVar5 = local_534;
    }
  }
  local_534 = RVar5;
  return local_534;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}